

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O1

quad_value_bit_vector *
bsim::andr(quad_value_bit_vector *__return_storage_ptr__,quad_value_bit_vector *a)

{
  uchar uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  string local_38;
  
  uVar2 = (ulong)a->N;
  bVar4 = 0 < (long)uVar2;
  if (0 < (long)uVar2) {
    uVar3 = 1;
    do {
      uVar1 = (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar3 - 1].value;
      if (uVar1 != '\x01') {
        if (uVar1 == '\x03') {
          __assert_fail("!a.is_high_impedance()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0x109,"bool bsim::operator!=(const quad_value &, const quad_value &)");
        }
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"0","");
        quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,1,&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p);
        }
        if (bVar4) {
          return __return_storage_ptr__;
        }
        break;
      }
      bVar4 = uVar3 < uVar2;
      bVar5 = uVar3 != uVar2;
      uVar3 = uVar3 + 1;
    } while (bVar5);
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"1","");
  quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,1,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline quad_value_bit_vector
  andr(const quad_value_bit_vector& a) {
    for (int i = 0; i < a.bitLength(); i++) {
      if (a.get(i) != 1) {
	return quad_value_bit_vector(1, "0");
      }
    }

    return quad_value_bit_vector(1, "1");
  }